

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_charcode.hpp
# Opt level: O2

string * __thiscall
iutest::detail::AnyStringToMultiByteString_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *str,int num)

{
  allocator<char> local_9;
  
  if ((int)str < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,this + ((ulong)str & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string AnyStringToMultiByteString(const char* str, int num = -1)
{
    return num < 0 ? str : ::std::string(str, static_cast<size_t>(num));
}